

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_state.hpp
# Opt level: O1

void __thiscall
foxxll::shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
          (shared_state<foxxll::request_queue_impl_worker::thread_state> *this,value_type *new_state
          )

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->state_ = *new_state;
  std::unique_lock<std::mutex>::unlock(&local_28);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void set_to(const value_type& new_state)
    {
        std::unique_lock<std::mutex> lock(mutex_);
        state_ = new_state;
        lock.unlock();
        cv_.notify_all();
    }